

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_each.cpp
# Opt level: O0

void __thiscall tst_helpers_each::functorThrows(tst_helpers_each *this)

{
  initializer_list<int> args;
  QString local_b0;
  QString local_98;
  QString local_80;
  anon_class_1_0_00000001_for_fn local_55;
  int local_54 [3];
  iterator local_48;
  undefined8 local_40;
  QList<int> local_38;
  undefined1 local_20 [8];
  QPromise<QList<int>_> p;
  tst_helpers_each *this_local;
  
  local_54[0] = 0x2a;
  local_54[1] = 0x2b;
  local_54[2] = 0x2c;
  local_48 = local_54;
  local_40 = 3;
  args._M_len = 3;
  args._M_array = local_48;
  p.super_QPromiseBase<QList<int>_>.m_d.d = (PromiseData<QList<int>_> *)this;
  QList<int>::QList(&local_38,args);
  QtPromise::each<QList<int>,tst_helpers_each::functorThrows()::__0>
            ((QtPromise *)local_20,&local_38,&local_55);
  QList<int>::~QList(&local_38);
  QString::QString(&local_98);
  waitForError<QList<int>,QString>(&local_80,(QPromise<QList<int>_> *)local_20,&local_98);
  QString::QString(&local_b0,"foo");
  QTest::qCompare(&local_80,&local_b0,"waitForError(p, QString{})","QString{\"foo\"}",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_each.cpp"
                  ,0x85);
  QString::~QString(&local_b0);
  QString::~QString(&local_80);
  QString::~QString(&local_98);
  QtPromise::QPromise<QList<int>_>::~QPromise((QPromise<QList<int>_> *)local_20);
  return;
}

Assistant:

void tst_helpers_each::functorThrows()
{
    auto p = QtPromise::each(QVector<int>{42, 43, 44}, [](int v, ...) {
        if (v == 44) {
            throw QString{"foo"};
        }
    });

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVector<int>>>::value));
    QCOMPARE(waitForError(p, QString{}), QString{"foo"});
}